

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          string_view fileSetType,string_view description,Action action)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmFileSet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  undefined1 local_c0 [48];
  string_view fileSetType_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  fileSetType_local._M_str = fileSetType._M_str;
  fileSetType_local._M_len = fileSetType._M_len;
  this_00 = cmTarget::GetFileSet(self,fileSetName);
  if (this_00 == (cmFileSet *)0x0) {
    pcVar1 = this->Makefile;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[26]>
              ((string *)(local_c0 + 0x10),&description,(char (*) [26])0x7b97fa);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_c0 + 0x10));
  }
  else {
    __x._M_str = (this_00->Type)._M_dataplus._M_p;
    __x._M_len = (this_00->Type)._M_string_length;
    bVar2 = std::operator!=(__x,fileSetType);
    if (!bVar2) {
      if (value->_M_string_length == 0) {
        return;
      }
      std::__cxx11::string::string((string *)&local_80,(string *)value);
      cmMakefile::GetBacktrace((cmMakefile *)local_c0);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_60,&local_80,(cmListFileBacktrace *)local_c0);
      cmFileSet::AddDirectoryEntry(this_00,&local_60);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
      this_01 = &local_80;
      goto LAB_0034b7ed;
    }
    pcVar1 = this->Makefile;
    cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[19],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
              ((string *)(local_c0 + 0x10),(char (*) [11])"File set \"",fileSetName,
               (char (*) [19])"\" is not of type \"",&fileSetType_local,(char (*) [3])0x795130);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)(local_c0 + 0x10));
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c0 + 0x10);
LAB_0034b7ed:
  std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void cmTargetInternals::AddDirectoryToFileSet(cmTarget* self,
                                              std::string const& fileSetName,
                                              ValueType value,
                                              cm::string_view fileSetType,
                                              cm::string_view description,
                                              FileSetType::Action action)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (action == FileSetType::Action::Set) {
    fileSet->ClearDirectoryEntries();
  }
  if (cmNonempty(value)) {
    fileSet->AddDirectoryEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}